

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiResourceUpdateBatch::uploadStaticBuffer
          (QRhiResourceUpdateBatch *this,QRhiBuffer *buf,void *data)

{
  int iVar1;
  QRhiResourceUpdateBatchPrivate *pQVar2;
  long in_FS_OFFSET;
  BufferOp BStack_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (buf->m_size != 0) {
    pQVar2 = this->d;
    iVar1 = pQVar2->activeBufferOpCount;
    pQVar2->activeBufferOpCount = iVar1 + 1;
    if ((long)iVar1 <
        (pQVar2->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
        super_QVLABaseBase.s) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload
                  ((BufferOp *)
                   ((long)iVar1 * 0x30 +
                   (long)(pQVar2->bufferOps).
                         super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.super_QVLABaseBase
                         .ptr),buf,0,0,data);
        return;
      }
      goto LAB_003ee40b;
    }
    QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload(&BStack_48,buf,0,0,data);
    QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL>::
    emplace_back<QRhiResourceUpdateBatchPrivate::BufferOp>(&pQVar2->bufferOps,&BStack_48);
    QRhiBufferData::~QRhiBufferData(&BStack_48.data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003ee40b:
  __stack_chk_fail();
}

Assistant:

void QRhiResourceUpdateBatch::uploadStaticBuffer(QRhiBuffer *buf, const void *data)
{
    if (buf->size() > 0) {
        const int idx = d->activeBufferOpCount++;
        if (idx < d->bufferOps.size())
            QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload(&d->bufferOps[idx], buf, 0, 0, data);
        else
            d->bufferOps.append(QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload(buf, 0, 0, data));
    }
}